

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jitallocator.cpp
# Opt level: O1

Error __thiscall asmjit::v1_14::JitAllocator::release(JitAllocator *this,void *rx)

{
  uint32_t *puVar1;
  long *plVar2;
  uint uVar3;
  Impl *pIVar4;
  long lVar5;
  long lVar6;
  byte bVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  ulong *puVar12;
  JitAllocatorBlock *pJVar13;
  ulong uVar14;
  pthread_mutex_t *__mutex;
  Error EVar15;
  ulong uVar16;
  void *pvVar17;
  ulong *puVar18;
  JitAllocatorPool *pJVar19;
  BitWord *pBVar20;
  uint uVar21;
  uint uVar23;
  ulong uVar24;
  JitAllocatorBlock *impl;
  uint32_t uVar25;
  Compare<(asmjit::v1_14::Support::SortOrder)0> local_75;
  uint local_74;
  ulong local_70;
  BitWord *local_68;
  JitAllocatorPool *local_60;
  pthread_mutex_t *local_58;
  ulong local_50;
  BitWord *local_48;
  ZoneTree<asmjit::v1_14::JitAllocatorBlock> *local_40;
  Impl *local_38;
  ulong uVar22;
  
  pIVar4 = this->_impl;
  if (pIVar4 == (Impl *)JitAllocatorImpl_none) {
    EVar15 = 5;
  }
  else if (rx == (void *)0x0) {
    EVar15 = 2;
  }
  else {
    __mutex = (pthread_mutex_t *)(pIVar4 + 1);
    pthread_mutex_lock(__mutex);
    puVar1 = &pIVar4[4].granularity;
    for (impl = *(JitAllocatorBlock **)&pIVar4[4].granularity; impl != (JitAllocatorBlock *)0x0;
        impl = (JitAllocatorBlock *)
               (*(ulong *)(&impl->super_ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock> +
                          (ulong)(uVar9 >> 0x1f) * 8) & 0xfffffffffffffffe)) {
      pvVar17 = (impl->_mapping).rx;
      uVar9 = (uint)(rx < pvVar17) - (uint)((void *)((long)pvVar17 + impl->_blockSize) <= rx);
      if (uVar9 == 0) goto LAB_0010fec2;
    }
    impl = (JitAllocatorBlock *)0x0;
LAB_0010fec2:
    if (impl == (JitAllocatorBlock *)0x0) {
      EVar15 = 3;
    }
    else {
      pJVar19 = impl->_pool;
      pBVar20 = impl->_stopBitVector;
      uVar24 = (ulong)((long)rx - (long)(impl->_mapping).rx) >> (pJVar19->granularityLog2 & 0x3f);
      uVar9 = (uint)uVar24;
      puVar12 = pBVar20 + (uVar24 >> 6 & 0x3ffffff);
      uVar14 = (*puVar12 >> ((byte)uVar24 & 0x3f)) << ((byte)uVar24 & 0x3f);
      while (uVar14 == 0) {
        puVar18 = puVar12 + 1;
        puVar12 = puVar12 + 1;
        uVar14 = *puVar18;
      }
      lVar6 = 0;
      if (uVar14 != 0) {
        for (; (uVar14 >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
        }
      }
      uVar14 = lVar6 + ((long)puVar12 - (long)pBVar20) * 8;
      uVar10 = (int)uVar14 + 1;
      *(long *)(pIVar4 + 4) = *(long *)(pIVar4 + 4) + -1;
      uVar21 = uVar10 - uVar9;
      uVar22 = (ulong)uVar21;
      uVar3 = impl->_flags;
      plVar2 = (long *)((long)pJVar19->totalAreaUsed + (ulong)(uVar3 & 8));
      *plVar2 = *plVar2 - uVar22;
      uVar23 = impl->_areaUsed - uVar21;
      uVar11 = impl->_searchStart;
      if (uVar9 <= impl->_searchStart) {
        uVar11 = uVar9;
      }
      uVar8 = impl->_searchEnd;
      if (impl->_searchEnd <= uVar10) {
        uVar8 = uVar10;
      }
      impl->_areaUsed = uVar23;
      impl->_searchStart = uVar11;
      impl->_searchEnd = uVar8;
      local_40 = (ZoneTree<asmjit::v1_14::JitAllocatorBlock> *)puVar1;
      local_38 = pIVar4;
      if (uVar10 != uVar9) {
        local_48 = impl->_usedBitVector;
        local_50 = uVar24 >> 6 & 0x3ffffff;
        uVar24 = 0x40 - (ulong)(uVar9 & 0x3f);
        if (uVar22 <= uVar24) {
          uVar24 = uVar22;
        }
        puVar12 = local_48 + local_50;
        puVar18 = puVar12 + 1;
        *puVar12 = *puVar12 &
                   ~((0xffffffffffffffffU >> (-(char)uVar24 & 0x3fU)) << (sbyte)(uVar9 & 0x3f));
        uVar16 = uVar22 - uVar24;
        if (0x3f < uVar16) {
          uVar16 = (uVar22 - uVar24) - 0x40;
          uVar24 = uVar16 >> 6;
          local_74 = uVar23;
          local_70 = uVar22;
          local_68 = pBVar20;
          local_60 = pJVar19;
          local_58 = __mutex;
          memset(puVar18,0,uVar24 * 8 + 8);
          uVar21 = (uint)local_70;
          uVar16 = (ulong)((uint)uVar16 & 0x3f);
          puVar18 = local_48 + uVar24 + local_50 + 2;
          __mutex = local_58;
          pJVar19 = local_60;
          pBVar20 = local_68;
          uVar23 = local_74;
        }
        if (uVar16 != 0) {
          *puVar18 = *puVar18 & ~(0xffffffffffffffffU >> (-(char)uVar16 & 0x3fU));
        }
      }
      pIVar4 = local_38;
      bVar7 = (byte)uVar14 & 0x3f;
      pBVar20[uVar14 >> 6 & 0x3ffffff] =
           pBVar20[uVar14 >> 6 & 0x3ffffff] & (-2L << bVar7 | 0xfffffffffffffffeU >> 0x40 - bVar7);
      uVar11 = uVar3 & 1;
      if (uVar23 == uVar11) {
        impl->_searchStart = uVar11;
        impl->_searchEnd = impl->_areaSize;
        impl->_largestUnusedArea = impl->_areaSize - uVar11;
        uVar25 = uVar3 & 0xfffffff9 | 2;
      }
      else {
        uVar25 = uVar3 | 4;
      }
      impl->_flags = uVar25;
      if ((local_38->options & kFillUnusedMemory) != kNone) {
        pvVar17 = (void *)((ulong)(pJVar19->granularity * uVar9) + (long)(impl->_mapping).rw);
        uVar14 = (ulong)(pJVar19->granularity * uVar21);
        VirtMem::protectJitMemory(kReadWrite);
        JitAllocatorImpl_fillPattern(pvVar17,pIVar4->fillPattern,uVar14);
        VirtMem::protectJitMemory(kReadExecute);
        VirtMem::flushInstructionCache(pvVar17,uVar14);
      }
      EVar15 = 0;
      if ((impl->_flags & 2) != 0) {
        if ((pJVar19->emptyBlockCount == '\0') && ((pIVar4->options & kImmediateRelease) == kNone))
        {
          pJVar19->emptyBlockCount = '\x01';
        }
        else {
          pJVar19 = impl->_pool;
          if (pJVar19->cursor == impl) {
            pJVar13 = *(JitAllocatorBlock **)
                       &impl->super_ZoneListNode<asmjit::v1_14::JitAllocatorBlock>;
            if (pJVar13 == (JitAllocatorBlock *)0x0) {
              pJVar13 = *(JitAllocatorBlock **)&impl->field_0x18;
            }
            pJVar19->cursor = pJVar13;
          }
          pJVar13 = impl;
          ZoneTree<asmjit::v1_14::JitAllocatorBlock>::
          remove<asmjit::v1_14::Support::Compare<(asmjit::v1_14::Support::SortOrder)0>>
                    (local_40,(ZoneTreeNode *)impl,&local_75);
          lVar6 = *(long *)&impl->super_ZoneListNode<asmjit::v1_14::JitAllocatorBlock>;
          lVar5 = *(long *)&impl->field_0x18;
          if (lVar6 == 0) {
            *(long *)pJVar19 = lVar5;
          }
          else {
            *(long *)(lVar6 + 0x18) = lVar5;
            *(undefined8 *)&impl->super_ZoneListNode<asmjit::v1_14::JitAllocatorBlock> = 0;
          }
          if (lVar5 == 0) {
            *(long *)&pJVar19->field_0x8 = lVar6;
          }
          else {
            *(long *)(lVar5 + 0x10) = lVar6;
            *(undefined8 *)&impl->field_0x18 = 0;
          }
          *(undefined8 *)&impl->super_ZoneListNode<asmjit::v1_14::JitAllocatorBlock> = 0;
          *(undefined8 *)&impl->field_0x18 = 0;
          uVar9 = impl->_flags;
          pJVar19->blockCount = pJVar19->blockCount - 1;
          uVar3 = impl->_areaSize;
          uVar14 = (ulong)(uVar9 & 8);
          plVar2 = (long *)((long)pJVar19->totalAreaSize + uVar14);
          *plVar2 = *plVar2 - (ulong)uVar3;
          plVar2 = (long *)((long)pJVar19->totalAreaUsed + uVar14);
          *plVar2 = *plVar2 - (ulong)impl->_areaUsed;
          pJVar19->totalOverheadBytes =
               pJVar19->totalOverheadBytes - (ulong)((uVar3 + 0x3f >> 2 & 0xfffffff0) + 0x68);
          JitAllocatorImpl_deleteBlock((JitAllocatorPrivateImpl *)impl,pJVar13);
        }
      }
    }
    pthread_mutex_unlock(__mutex);
  }
  return EVar15;
}

Assistant:

Error JitAllocator::release(void* rx) noexcept {
  if (ASMJIT_UNLIKELY(_impl == &JitAllocatorImpl_none))
    return DebugUtils::errored(kErrorNotInitialized);

  if (ASMJIT_UNLIKELY(!rx))
    return DebugUtils::errored(kErrorInvalidArgument);

  JitAllocatorPrivateImpl* impl = static_cast<JitAllocatorPrivateImpl*>(_impl);
  LockGuard guard(impl->lock);

  JitAllocatorBlock* block = impl->tree.get(static_cast<uint8_t*>(rx));
  if (ASMJIT_UNLIKELY(!block))
    return DebugUtils::errored(kErrorInvalidState);

  // Offset relative to the start of the block.
  JitAllocatorPool* pool = block->pool();
  size_t offset = (size_t)((uint8_t*)rx - block->rxPtr());

  // The first bit representing the allocated area and its size.
  uint32_t areaIndex = uint32_t(offset >> pool->granularityLog2);
  uint32_t areaEnd = uint32_t(Support::bitVectorIndexOf(block->_stopBitVector, areaIndex, true)) + 1;
  uint32_t areaSize = areaEnd - areaIndex;

  impl->allocationCount--;
  block->markReleasedArea(areaIndex, areaEnd);

  // Fill the released memory if the secure mode is enabled.
  if (Support::test(impl->options, JitAllocatorOptions::kFillUnusedMemory)) {
    uint8_t* spanPtr = block->rwPtr() + areaIndex * pool->granularity;
    size_t spanSize = areaSize * pool->granularity;

    VirtMem::ProtectJitReadWriteScope scope(spanPtr, spanSize);
    JitAllocatorImpl_fillPattern(spanPtr, impl->fillPattern, spanSize);
  }

  // Release the whole block if it became empty.
  if (block->empty()) {
    if (pool->emptyBlockCount || Support::test(impl->options, JitAllocatorOptions::kImmediateRelease)) {
      JitAllocatorImpl_removeBlock(impl, block);
      JitAllocatorImpl_deleteBlock(impl, block);
    }
    else {
      pool->emptyBlockCount++;
    }
  }

  return kErrorOk;
}